

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

int wally_varbuff_get_length(uchar *bytes,size_t bytes_len,size_t *written)

{
  int iVar1;
  long lVar2;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar1 = -2;
  if ((bytes_len == 0) != (bytes != (uchar *)0x0) && written != (size_t *)0x0) {
    lVar2 = 1;
    if ((0xfc < bytes_len) && (lVar2 = 3, 0xffff < bytes_len)) {
      lVar2 = (ulong)(bytes_len >> 0x20 != 0) * 4 + 5;
    }
    *written = lVar2 + bytes_len;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int wally_varbuff_get_length(const unsigned char *bytes, size_t bytes_len, size_t *written)
{
    if (written)
        *written = 0;
    if (BYTES_INVALID(bytes, bytes_len) || !written)
        return WALLY_EINVAL;
    *written = varint_get_length(bytes_len) + bytes_len;
    return WALLY_OK;
}